

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.cpp
# Opt level: O0

void __thiscall argo::pointer::pointer(pointer *this,string *pointer)

{
  char *pcVar1;
  type pbVar2;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38 [3];
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_20;
  string *local_18;
  string *pointer_local;
  pointer *this_local;
  
  local_18 = pointer;
  pointer_local = (string *)this;
  std::__cxx11::list<argo::pointer::token,_std::allocator<argo::pointer::token>_>::list
            (&this->m_path);
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
  if (*pcVar1 == '#') {
    utf8::json_string_to_utf8((utf8 *)&local_20,local_18);
    pbVar2 = std::
             unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*(&local_20);
    build_from_uri_fragment(this,pbVar2);
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&local_20);
  }
  else {
    utf8::json_string_to_utf8((utf8 *)local_38,local_18);
    pbVar2 = std::
             unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*(local_38);
    build_from_json_string(this,pbVar2);
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(local_38);
  }
  return;
}

Assistant:

pointer::pointer(const std::string &pointer)
{
    // is this a URI fragment type pointer?
    if (pointer[0] == '#')
    {
        build_from_uri_fragment(*utf8::json_string_to_utf8(pointer));
    }
    else
    {
        build_from_json_string(*utf8::json_string_to_utf8(pointer));
    }
}